

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::Model::Model(Model *this,Model *from)

{
  uint32 uVar1;
  void *pvVar2;
  ModelDescription *from_00;
  ModelDescription *this_00;
  PipelineClassifier *this_01;
  PipelineClassifier *from_01;
  OneHotEncoder *this_02;
  OneHotEncoder *from_02;
  TextClassifier *this_03;
  TextClassifier *from_03;
  GLMClassifier *this_04;
  GLMClassifier *from_04;
  GLMRegressor *this_05;
  GLMRegressor *from_05;
  Normalizer *this_06;
  Normalizer *from_06;
  FeatureVectorizer *this_07;
  FeatureVectorizer *from_07;
  Scaler *this_08;
  Scaler *from_08;
  DictVectorizer *this_09;
  DictVectorizer *from_09;
  NonMaximumSuppression *this_10;
  NonMaximumSuppression *from_10;
  Imputer *this_11;
  Imputer *from_11;
  ArrayFeatureExtractor *this_12;
  ArrayFeatureExtractor *from_12;
  CategoricalMapping *this_13;
  CategoricalMapping *from_13;
  Pipeline *this_14;
  Pipeline *from_14;
  KNearestNeighborsClassifier *this_15;
  KNearestNeighborsClassifier *from_15;
  NeuralNetwork *this_16;
  NeuralNetwork *from_16;
  BayesianProbitRegressor *this_17;
  BayesianProbitRegressor *from_17;
  Gazetteer *this_18;
  Gazetteer *from_18;
  TreeEnsembleClassifier *this_19;
  TreeEnsembleClassifier *from_19;
  SerializedModel *this_20;
  SerializedModel *from_20;
  ItemSimilarityRecommender *this_21;
  ItemSimilarityRecommender *from_21;
  Identity *this_22;
  Identity *from_22;
  NeuralNetworkClassifier *this_23;
  NeuralNetworkClassifier *from_23;
  LinkedModel *this_24;
  LinkedModel *from_24;
  TreeEnsembleRegressor *this_25;
  TreeEnsembleRegressor *from_25;
  VisionFeaturePrint *this_26;
  VisionFeaturePrint *from_26;
  SupportVectorClassifier *this_27;
  SupportVectorClassifier *from_27;
  NeuralNetworkRegressor *this_28;
  NeuralNetworkRegressor *from_28;
  SoundAnalysisPreprocessing *this_29;
  SoundAnalysisPreprocessing *from_29;
  CustomModel *this_30;
  CustomModel *from_30;
  SupportVectorRegressor *this_31;
  SupportVectorRegressor *from_31;
  WordTagger *this_32;
  WordTagger *from_32;
  PipelineRegressor *this_33;
  PipelineRegressor *from_33;
  WordEmbedding *this_34;
  WordEmbedding *from_34;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Model_00765010;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  from_00 = from->description_;
  if (from_00 == (ModelDescription *)0x0 || from == (Model *)&_Model_default_instance_) {
    this_00 = (ModelDescription *)0x0;
  }
  else {
    this_00 = (ModelDescription *)operator_new(0x78);
    ModelDescription::ModelDescription(this_00,from_00);
  }
  this->description_ = this_00;
  this->specificationversion_ = from->specificationversion_;
  this->isupdatable_ = from->isupdatable_;
  this->_oneof_case_[0] = 0;
  uVar1 = from->_oneof_case_[0];
  switch(uVar1) {
  case 600:
    this_02 = mutable_onehotencoder(this);
    from_02 = onehotencoder(from);
    OneHotEncoder::MergeFrom(this_02,from_02);
    break;
  case 0x259:
    this_11 = mutable_imputer(this);
    from_11 = imputer(from);
    Imputer::MergeFrom(this_11,from_11);
    break;
  case 0x25a:
    this_07 = mutable_featurevectorizer(this);
    from_07 = featurevectorizer(from);
    FeatureVectorizer::MergeFrom(this_07,from_07);
    break;
  case 0x25b:
    this_09 = mutable_dictvectorizer(this);
    from_09 = dictvectorizer(from);
    DictVectorizer::MergeFrom(this_09,from_09);
    break;
  case 0x25c:
    this_08 = mutable_scaler(this);
    from_08 = scaler(from);
    Scaler::MergeFrom(this_08,from_08);
    break;
  case 0x25d:
  case 0x260:
    break;
  case 0x25e:
    this_13 = mutable_categoricalmapping(this);
    from_13 = categoricalmapping(from);
    CategoricalMapping::MergeFrom(this_13,from_13);
    break;
  case 0x25f:
    this_06 = mutable_normalizer(this);
    from_06 = normalizer(from);
    Normalizer::MergeFrom(this_06,from_06);
    break;
  case 0x261:
    this_12 = mutable_arrayfeatureextractor(this);
    from_12 = arrayfeatureextractor(from);
    ArrayFeatureExtractor::MergeFrom(this_12,from_12);
    break;
  case 0x262:
    this_10 = mutable_nonmaximumsuppression(this);
    from_10 = nonmaximumsuppression(from);
    NonMaximumSuppression::MergeFrom(this_10,from_10);
    break;
  default:
    switch(uVar1) {
    case 2000:
      this_03 = mutable_textclassifier(this);
      from_03 = textclassifier(from);
      CoreMLModels::TextClassifier::MergeFrom(this_03,from_03);
      break;
    case 0x7d1:
      this_32 = mutable_wordtagger(this);
      from_32 = wordtagger(from);
      CoreMLModels::WordTagger::MergeFrom(this_32,from_32);
      break;
    case 0x7d2:
      this_26 = mutable_visionfeatureprint(this);
      from_26 = visionfeatureprint(from);
      CoreMLModels::VisionFeaturePrint::MergeFrom(this_26,from_26);
      break;
    case 0x7d3:
      this_29 = mutable_soundanalysispreprocessing(this);
      from_29 = soundanalysispreprocessing(from);
      CoreMLModels::SoundAnalysisPreprocessing::MergeFrom(this_29,from_29);
      break;
    case 0x7d4:
      this_18 = mutable_gazetteer(this);
      from_18 = gazetteer(from);
      CoreMLModels::Gazetteer::MergeFrom(this_18,from_18);
      break;
    case 0x7d5:
      this_34 = mutable_wordembedding(this);
      from_34 = wordembedding(from);
      CoreMLModels::WordEmbedding::MergeFrom(this_34,from_34);
      break;
    default:
      switch(uVar1) {
      case 300:
        this_05 = mutable_glmregressor(this);
        from_05 = glmregressor(from);
        GLMRegressor::MergeFrom(this_05,from_05);
        break;
      case 0x12d:
        this_31 = mutable_supportvectorregressor(this);
        from_31 = supportvectorregressor(from);
        SupportVectorRegressor::MergeFrom(this_31,from_31);
        break;
      case 0x12e:
        this_25 = mutable_treeensembleregressor(this);
        from_25 = treeensembleregressor(from);
        TreeEnsembleRegressor::MergeFrom(this_25,from_25);
        break;
      case 0x12f:
        this_28 = mutable_neuralnetworkregressor(this);
        from_28 = neuralnetworkregressor(from);
        NeuralNetworkRegressor::MergeFrom(this_28,from_28);
        break;
      case 0x130:
        this_17 = mutable_bayesianprobitregressor(this);
        from_17 = bayesianprobitregressor(from);
        BayesianProbitRegressor::MergeFrom(this_17,from_17);
        break;
      default:
        switch(uVar1) {
        case 400:
          this_04 = mutable_glmclassifier(this);
          from_04 = glmclassifier(from);
          GLMClassifier::MergeFrom(this_04,from_04);
          break;
        case 0x191:
          this_27 = mutable_supportvectorclassifier(this);
          from_27 = supportvectorclassifier(from);
          SupportVectorClassifier::MergeFrom(this_27,from_27);
          break;
        case 0x192:
          this_19 = mutable_treeensembleclassifier(this);
          from_19 = treeensembleclassifier(from);
          TreeEnsembleClassifier::MergeFrom(this_19,from_19);
          break;
        case 0x193:
          this_23 = mutable_neuralnetworkclassifier(this);
          from_23 = neuralnetworkclassifier(from);
          NeuralNetworkClassifier::MergeFrom(this_23,from_23);
          break;
        case 0x194:
          this_15 = mutable_knearestneighborsclassifier(this);
          from_15 = knearestneighborsclassifier(from);
          KNearestNeighborsClassifier::MergeFrom(this_15,from_15);
          break;
        default:
          if (uVar1 == 3000) {
            this_20 = mutable_serializedmodel(this);
            from_20 = serializedmodel(from);
            SerializedModel::MergeFrom(this_20,from_20);
          }
          else if (uVar1 == 0xc9) {
            this_33 = mutable_pipelineregressor(this);
            from_33 = pipelineregressor(from);
            PipelineRegressor::MergeFrom(this_33,from_33);
          }
          else if (uVar1 == 0xca) {
            this_14 = mutable_pipeline(this);
            from_14 = pipeline(from);
            Pipeline::MergeFrom(this_14,from_14);
          }
          else if (uVar1 == 500) {
            this_16 = mutable_neuralnetwork(this);
            from_16 = neuralnetwork(from);
            NeuralNetwork::MergeFrom(this_16,from_16);
          }
          else if (uVar1 == 0x1f5) {
            this_21 = mutable_itemsimilarityrecommender(this);
            from_21 = itemsimilarityrecommender(from);
            ItemSimilarityRecommender::MergeFrom(this_21,from_21);
          }
          else if (uVar1 == 0x22b) {
            this_30 = mutable_custommodel(this);
            from_30 = custommodel(from);
            CustomModel::MergeFrom(this_30,from_30);
          }
          else if (uVar1 == 0x22c) {
            this_24 = mutable_linkedmodel(this);
            from_24 = linkedmodel(from);
            LinkedModel::MergeFrom(this_24,from_24);
          }
          else if (uVar1 == 900) {
            this_22 = mutable_identity(this);
            from_22 = identity(from);
            Identity::MergeFrom(this_22,from_22);
          }
          else if (uVar1 == 200) {
            this_01 = mutable_pipelineclassifier(this);
            from_01 = pipelineclassifier(from);
            PipelineClassifier::MergeFrom(this_01,from_01);
          }
        }
      }
    }
  }
  return;
}

Assistant:

Model::Model(const Model& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_description()) {
    description_ = new ::CoreML::Specification::ModelDescription(*from.description_);
  } else {
    description_ = NULL;
  }
  ::memcpy(&specificationversion_, &from.specificationversion_,
    reinterpret_cast<char*>(&isupdatable_) -
    reinterpret_cast<char*>(&specificationversion_) + sizeof(isupdatable_));
  clear_has_Type();
  switch (from.Type_case()) {
    case kPipelineClassifier: {
      mutable_pipelineclassifier()->::CoreML::Specification::PipelineClassifier::MergeFrom(from.pipelineclassifier());
      break;
    }
    case kPipelineRegressor: {
      mutable_pipelineregressor()->::CoreML::Specification::PipelineRegressor::MergeFrom(from.pipelineregressor());
      break;
    }
    case kPipeline: {
      mutable_pipeline()->::CoreML::Specification::Pipeline::MergeFrom(from.pipeline());
      break;
    }
    case kGlmRegressor: {
      mutable_glmregressor()->::CoreML::Specification::GLMRegressor::MergeFrom(from.glmregressor());
      break;
    }
    case kSupportVectorRegressor: {
      mutable_supportvectorregressor()->::CoreML::Specification::SupportVectorRegressor::MergeFrom(from.supportvectorregressor());
      break;
    }
    case kTreeEnsembleRegressor: {
      mutable_treeensembleregressor()->::CoreML::Specification::TreeEnsembleRegressor::MergeFrom(from.treeensembleregressor());
      break;
    }
    case kNeuralNetworkRegressor: {
      mutable_neuralnetworkregressor()->::CoreML::Specification::NeuralNetworkRegressor::MergeFrom(from.neuralnetworkregressor());
      break;
    }
    case kBayesianProbitRegressor: {
      mutable_bayesianprobitregressor()->::CoreML::Specification::BayesianProbitRegressor::MergeFrom(from.bayesianprobitregressor());
      break;
    }
    case kGlmClassifier: {
      mutable_glmclassifier()->::CoreML::Specification::GLMClassifier::MergeFrom(from.glmclassifier());
      break;
    }
    case kSupportVectorClassifier: {
      mutable_supportvectorclassifier()->::CoreML::Specification::SupportVectorClassifier::MergeFrom(from.supportvectorclassifier());
      break;
    }
    case kTreeEnsembleClassifier: {
      mutable_treeensembleclassifier()->::CoreML::Specification::TreeEnsembleClassifier::MergeFrom(from.treeensembleclassifier());
      break;
    }
    case kNeuralNetworkClassifier: {
      mutable_neuralnetworkclassifier()->::CoreML::Specification::NeuralNetworkClassifier::MergeFrom(from.neuralnetworkclassifier());
      break;
    }
    case kKNearestNeighborsClassifier: {
      mutable_knearestneighborsclassifier()->::CoreML::Specification::KNearestNeighborsClassifier::MergeFrom(from.knearestneighborsclassifier());
      break;
    }
    case kNeuralNetwork: {
      mutable_neuralnetwork()->::CoreML::Specification::NeuralNetwork::MergeFrom(from.neuralnetwork());
      break;
    }
    case kItemSimilarityRecommender: {
      mutable_itemsimilarityrecommender()->::CoreML::Specification::ItemSimilarityRecommender::MergeFrom(from.itemsimilarityrecommender());
      break;
    }
    case kCustomModel: {
      mutable_custommodel()->::CoreML::Specification::CustomModel::MergeFrom(from.custommodel());
      break;
    }
    case kLinkedModel: {
      mutable_linkedmodel()->::CoreML::Specification::LinkedModel::MergeFrom(from.linkedmodel());
      break;
    }
    case kOneHotEncoder: {
      mutable_onehotencoder()->::CoreML::Specification::OneHotEncoder::MergeFrom(from.onehotencoder());
      break;
    }
    case kImputer: {
      mutable_imputer()->::CoreML::Specification::Imputer::MergeFrom(from.imputer());
      break;
    }
    case kFeatureVectorizer: {
      mutable_featurevectorizer()->::CoreML::Specification::FeatureVectorizer::MergeFrom(from.featurevectorizer());
      break;
    }
    case kDictVectorizer: {
      mutable_dictvectorizer()->::CoreML::Specification::DictVectorizer::MergeFrom(from.dictvectorizer());
      break;
    }
    case kScaler: {
      mutable_scaler()->::CoreML::Specification::Scaler::MergeFrom(from.scaler());
      break;
    }
    case kCategoricalMapping: {
      mutable_categoricalmapping()->::CoreML::Specification::CategoricalMapping::MergeFrom(from.categoricalmapping());
      break;
    }
    case kNormalizer: {
      mutable_normalizer()->::CoreML::Specification::Normalizer::MergeFrom(from.normalizer());
      break;
    }
    case kArrayFeatureExtractor: {
      mutable_arrayfeatureextractor()->::CoreML::Specification::ArrayFeatureExtractor::MergeFrom(from.arrayfeatureextractor());
      break;
    }
    case kNonMaximumSuppression: {
      mutable_nonmaximumsuppression()->::CoreML::Specification::NonMaximumSuppression::MergeFrom(from.nonmaximumsuppression());
      break;
    }
    case kIdentity: {
      mutable_identity()->::CoreML::Specification::Identity::MergeFrom(from.identity());
      break;
    }
    case kTextClassifier: {
      mutable_textclassifier()->::CoreML::Specification::CoreMLModels::TextClassifier::MergeFrom(from.textclassifier());
      break;
    }
    case kWordTagger: {
      mutable_wordtagger()->::CoreML::Specification::CoreMLModels::WordTagger::MergeFrom(from.wordtagger());
      break;
    }
    case kVisionFeaturePrint: {
      mutable_visionfeatureprint()->::CoreML::Specification::CoreMLModels::VisionFeaturePrint::MergeFrom(from.visionfeatureprint());
      break;
    }
    case kSoundAnalysisPreprocessing: {
      mutable_soundanalysispreprocessing()->::CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing::MergeFrom(from.soundanalysispreprocessing());
      break;
    }
    case kGazetteer: {
      mutable_gazetteer()->::CoreML::Specification::CoreMLModels::Gazetteer::MergeFrom(from.gazetteer());
      break;
    }
    case kWordEmbedding: {
      mutable_wordembedding()->::CoreML::Specification::CoreMLModels::WordEmbedding::MergeFrom(from.wordembedding());
      break;
    }
    case kSerializedModel: {
      mutable_serializedmodel()->::CoreML::Specification::SerializedModel::MergeFrom(from.serializedmodel());
      break;
    }
    case TYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.Model)
}